

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall TasGrid::GridGlobal::loadGpuNodes<double>(GridGlobal *this)

{
  vector<int,_std::allocator<int>_> *cpu_data;
  AccelerationContext *pAVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  pointer __p;
  bool bVar2;
  int iVar3;
  CudaGlobalData<double> *pCVar4;
  int *piVar5;
  int iVar6;
  int local_124;
  int local_120;
  int num_basis;
  vector<int,_std::allocator<int>_> map_dims;
  vector<int,_std::allocator<int>_> active_num_points;
  vector<double,_std::allocator<double>_> tweights;
  vector<int,_std::allocator<int>_> map_tensor;
  vector<int,_std::allocator<int>_> map_index;
  vector<int,_std::allocator<int>_> dim_offsets;
  vector<int,_std::allocator<int>_> map_reference;
  vector<int,_std::allocator<int>_> map_level;
  
  pCVar4 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  if (pCVar4 == (CudaGlobalData<double> *)0x0) {
    Utils::make_unique<TasGrid::CudaGlobalData<double>>();
    __p = map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start;
    map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             *)&this->gpu_cache,(pointer)__p);
    ::std::
    unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                   *)&map_dims);
    pCVar4 = (this->gpu_cache)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
  }
  if ((pCVar4->nodes).num_entries == 0) {
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    bVar2 = OneDimensionalMeta::isNonNested(this->rule);
    if (bVar2) {
      Utils::mergeVectors<double>
                ((vector<double,_std::allocator<double>_> *)&map_dims,&(this->wrapper).nodes);
    }
    else {
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&map_dims,&(this->wrapper).unique);
    }
    GpuVector<double>::load
              (&pCVar4->nodes,pAVar1,(vector<double,_std::allocator<double>_> *)&map_dims);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&map_dims);
    pCVar4 = (this->gpu_cache)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    Utils::mergeVectors<double>
              ((vector<double,_std::allocator<double>_> *)&map_dims,&(this->wrapper).coeff);
    GpuVector<double>::load
              (&pCVar4->coeff,pAVar1,(vector<double,_std::allocator<double>_> *)&map_dims);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&map_dims);
    cpu_data = &(this->wrapper).num_points;
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                nodes_per_level,(this->super_BaseCanonicalGrid).acceleration,cpu_data);
    pCVar4 = (this->gpu_cache)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pAVar1 = (this->super_BaseCanonicalGrid).acceleration;
    OneDimensionalWrapper::getOffsetNodesPerLevel(&map_dims,&this->wrapper);
    GpuVector<int>::load(&pCVar4->offset_per_level,pAVar1,&map_dims);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_dims.super__Vector_base<int,_std::allocator<int>_>);
    map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    map_dims.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    map_level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    num_basis = 0;
    dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    dim_offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    for (tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start._0_4_ = 0;
        (int)tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start < (this->super_BaseCanonicalGrid).num_dimensions;
        tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ =
             (int)tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
      ::std::vector<int,_std::allocator<int>_>::push_back(&dim_offsets,&num_basis);
      active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      while( true ) {
        if ((this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start
            [(int)tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start] <
            (int)active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start) break;
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &map_dims.super__Vector_base<int,_std::allocator<int>_>,
                   (value_type_conflict3 *)&tweights);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  (&map_level,(value_type_conflict3 *)&active_num_points);
        num_basis = num_basis +
                    (cpu_data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start
                    [(int)active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start];
        active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (int)active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1;
      }
    }
    pCVar4 = (this->gpu_cache)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
             .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl;
    pCVar4->num_basis = num_basis;
    GpuVector<int>::load
              (&pCVar4->map_dimension,(this->super_BaseCanonicalGrid).acceleration,&map_dims);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_level,(this->super_BaseCanonicalGrid).acceleration,&map_level);
    ::std::vector<double,_std::allocator<double>_>::vector
              (&tweights,
               (long)(this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&active_num_points);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,TasGrid::GridGlobal::loadGpuNodes<double>()const::_lambda(int)_1_>
              ((this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->active_w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               CONCAT44(tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)tweights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start));
    GpuVector<double>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                tensor_weights,(this->super_BaseCanonicalGrid).acceleration,&tweights);
    GpuVector<int>::
    load<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                active_tensors,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    ::std::vector<int,_std::allocator<int>_>::vector
              (&active_num_points,
               (long)(this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&map_tensor);
    __result._M_current._4_4_ =
         active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start._4_4_;
    __result._M_current._0_4_ =
         (int)active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::GridGlobal::loadGpuNodes<double>()const::_lambda(int)_2_>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               (this->active_tensors).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,__result,(anon_class_8_1_8991fb9c)this);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                active_num_points,(this->super_BaseCanonicalGrid).acceleration,&active_num_points);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                dim_offsets,(this->super_BaseCanonicalGrid).acceleration,&dim_offsets);
    map_tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    map_tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    map_tensor.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    map_index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    map_reference.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    piVar5 = (int *)CONCAT44(active_num_points.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start._4_4_,
                             (int)active_num_points.super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
    for (local_120 = 0; local_120 < (this->active_tensors).cache_num_indexes;
        local_120 = local_120 + 1) {
      iVar6 = *piVar5;
      iVar3 = 1;
      while( true ) {
        piVar5 = piVar5 + 1;
        if ((this->super_BaseCanonicalGrid).num_dimensions <= iVar3) break;
        iVar6 = iVar6 * *piVar5;
        iVar3 = iVar3 + 1;
      }
      for (local_124 = 0; local_124 < iVar6; local_124 = local_124 + 1) {
        ::std::vector<int,_std::allocator<int>_>::push_back(&map_tensor,&local_120);
        ::std::vector<int,_std::allocator<int>_>::push_back(&map_index,&local_124);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  (&map_reference,
                   (value_type_conflict3 *)
                   ((long)local_124 * 4 +
                   *(long *)&(this->tensor_refs).
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_120].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data));
      }
    }
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_tensor,(this->super_BaseCanonicalGrid).acceleration,&map_tensor);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_index,(this->super_BaseCanonicalGrid).acceleration,&map_index);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
                map_reference,(this->super_BaseCanonicalGrid).acceleration,&map_reference);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_reference.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_index.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_tensor.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&active_num_points.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&tweights.super__Vector_base<double,_std::allocator<double>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&dim_offsets.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_level.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&map_dims.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void GridGlobal::loadGpuNodes() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaGlobalData<T>>();
    if (!ccache->nodes.empty()) return; // already loaded
    // data for stage 1 (Lagrange caching)
    ccache->nodes.load(acceleration, (OneDimensionalMeta::isNonNested(rule)) ? wrapper.getAllNodes() : wrapper.getUnique());
    ccache->coeff.load(acceleration, wrapper.getAllCoeff());
    ccache->nodes_per_level.load(acceleration, wrapper.getNumNodesPerLevel());
    ccache->offset_per_level.load(acceleration, wrapper.getOffsetNodesPerLevel());

    std::vector<int> map_dims, map_level, dim_offsets;
    int num_basis = 0;
    for(int dim=0; dim<num_dimensions; dim++){
        dim_offsets.push_back(num_basis);
        for(int level=0; level <= max_levels[dim]; level++){
            map_dims.push_back(dim);
            map_level.push_back(level);
            num_basis += wrapper.getNumPoints(level);
        }
    }
    ccache->num_basis = num_basis;
    ccache->map_dimension.load(acceleration, map_dims);
    ccache->map_level.load(acceleration, map_level);

    std::vector<double> tweights(active_w.size());
    std::transform(active_w.begin(), active_w.end(), tweights.begin(), [](int i)->double{ return static_cast<double>(i); });
    ccache->tensor_weights.load(acceleration, tweights);

    ccache->active_tensors.load(acceleration, active_tensors.begin(), active_tensors.end());

    std::vector<int> active_num_points(active_tensors.totalSize());
    std::transform(active_tensors.begin(), active_tensors.end(), active_num_points.begin(), [&](int i)->int{ return wrapper.getNumPoints(i); });
    ccache->active_num_points.load(acceleration, active_num_points);

    ccache->dim_offsets.load(acceleration, dim_offsets);

    std::vector<int> map_tensor, map_index, map_reference;
    auto inump = active_num_points.begin();
    for(int n=0; n<active_tensors.getNumIndexes(); n++){
        int num_tensor_points = *inump++;
        for(int j=1; j<num_dimensions; j++)
            num_tensor_points *= *inump++;

        for(int i=0; i<num_tensor_points; i++){
            map_tensor.push_back(n);
            map_index.push_back(i);
            map_reference.push_back(tensor_refs[n][i]);
        }
    }
    ccache->map_tensor.load(acceleration, map_tensor);
    ccache->map_index.load(acceleration, map_index);
    ccache->map_reference.load(acceleration, map_reference);
}